

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O0

RPCHelpMan * decodescript(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffed28;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar1;
  allocator<RPCResult> *paVar2;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_ffffffffffffed30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed60;
  allocator<char> *in_stack_ffffffffffffed68;
  char *in_stack_ffffffffffffed70;
  undefined7 in_stack_ffffffffffffed78;
  undefined1 in_stack_ffffffffffffed7f;
  string *in_stack_ffffffffffffed80;
  undefined7 in_stack_ffffffffffffed88;
  undefined1 in_stack_ffffffffffffed8f;
  undefined4 in_stack_ffffffffffffed90;
  Type in_stack_ffffffffffffed94;
  string *in_stack_ffffffffffffed98;
  undefined4 in_stack_ffffffffffffeda0;
  Type in_stack_ffffffffffffeda4;
  undefined4 in_stack_ffffffffffffeda8;
  Type in_stack_ffffffffffffedac;
  RPCResult *in_stack_ffffffffffffedb0;
  undefined1 *local_1240;
  undefined1 *local_1228;
  undefined1 *local_1210;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  RPCMethodImpl *fun;
  undefined1 local_fb0 [35];
  allocator<char> local_f8d;
  allocator<char> local_f8c;
  allocator<char> local_f8b [3];
  pointer local_f88;
  pointer pRStack_f80;
  pointer local_f78;
  allocator<char> local_f6a;
  allocator<char> local_f69 [31];
  allocator<char> local_f4a;
  allocator<char> local_f49;
  undefined1 local_f48 [30];
  undefined1 local_f2a;
  undefined1 local_f29 [31];
  undefined1 local_f0a [2];
  size_type local_f08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f00;
  allocator<char> local_eea;
  allocator<char> local_ee9 [9];
  size_type sStack_ee0;
  undefined1 local_ed8 [15];
  allocator<char> local_ec9 [31];
  allocator<char> local_eaa;
  allocator<char> local_ea9;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  allocator<char> local_e8a;
  allocator<char> local_e89;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  allocator<char> local_e6a;
  allocator<char> local_e69 [9];
  undefined8 uStack_e60;
  undefined8 local_e58;
  allocator<char> local_e49;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  allocator<char> local_e2a;
  allocator<char> local_e29;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  allocator<char> local_e0a;
  allocator<char> local_e09 [31];
  undefined1 local_dea [33];
  allocator<char> local_dc9;
  undefined4 local_dc8;
  allocator<char> local_dc1 [31];
  allocator<char> local_da2;
  allocator<char> local_da1 [641];
  undefined1 local_b20 [408];
  vector<RPCArg,_std::allocator<RPCArg>_> local_988 [17];
  undefined1 local_7f0 [448];
  undefined1 local_630 [816];
  undefined1 local_300 [200];
  undefined1 local_238;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined1 local_1f8;
  undefined1 local_1f7;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  local_dc8 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffed38,(Optional *)in_stack_ffffffffffffed30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  local_238 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffed40);
  local_210 = 0;
  uStack_208 = 0;
  local_200 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffed28);
  local_1f8 = 0;
  local_1f7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
                 in_stack_ffffffffffffed98,in_stack_ffffffffffffed94,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffed8f,in_stack_ffffffffffffed88),
                 in_stack_ffffffffffffed80,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffed28);
  __l._M_len._0_7_ = in_stack_ffffffffffffed78;
  __l._M_array = (iterator)in_stack_ffffffffffffed70;
  __l._M_len._7_1_ = in_stack_ffffffffffffed7f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffed68,__l,
             (allocator_type *)in_stack_ffffffffffffed60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  fun = (RPCMethodImpl *)local_dea;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  local_e28 = 0;
  uStack_e20 = 0;
  local_e18 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed28);
  RPCResult::RPCResult
            (in_stack_ffffffffffffedb0,in_stack_ffffffffffffedac,
             (string *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
             in_stack_ffffffffffffed98,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffed94,in_stack_ffffffffffffed90),
             (bool)in_stack_ffffffffffffed8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  local_e48 = 0;
  uStack_e40 = 0;
  local_e38 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed28);
  RPCResult::RPCResult
            (in_stack_ffffffffffffedb0,in_stack_ffffffffffffedac,
             (string *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
             in_stack_ffffffffffffed98,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffed94,in_stack_ffffffffffffed90),
             (bool)in_stack_ffffffffffffed8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  GetAllOutputTypes_abi_cxx11_();
  std::operator+((char *)in_stack_ffffffffffffed40,in_stack_ffffffffffffed38);
  std::operator+(in_stack_ffffffffffffed40,(char *)in_stack_ffffffffffffed38);
  local_e69[1] = (allocator<char>)0x0;
  local_e69[2] = (allocator<char>)0x0;
  local_e69[3] = (allocator<char>)0x0;
  local_e69[4] = (allocator<char>)0x0;
  local_e69[5] = (allocator<char>)0x0;
  local_e69[6] = (allocator<char>)0x0;
  local_e69[7] = (allocator<char>)0x0;
  local_e69[8] = (allocator<char>)0x0;
  uStack_e60 = 0;
  local_e58 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed28);
  RPCResult::RPCResult
            (in_stack_ffffffffffffedb0,in_stack_ffffffffffffedac,
             (string *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
             in_stack_ffffffffffffed98,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffed94,in_stack_ffffffffffffed90),
             (bool)in_stack_ffffffffffffed8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  local_e88 = 0;
  uStack_e80 = 0;
  local_e78 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed28);
  pvVar1 = (vector<RPCResult,_std::allocator<RPCResult>_> *)
           ((ulong)in_stack_ffffffffffffed28 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
             in_stack_ffffffffffffeda4,in_stack_ffffffffffffed98,
             SUB41(in_stack_ffffffffffffed94 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffed8f,in_stack_ffffffffffffed88),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed80,
             (bool)in_stack_ffffffffffffed7f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  local_ea8 = 0;
  uStack_ea0 = 0;
  local_e98 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar1);
  pvVar1 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar1 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
             in_stack_ffffffffffffeda4,in_stack_ffffffffffffed98,
             SUB41(in_stack_ffffffffffffed94 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffed8f,in_stack_ffffffffffffed88),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed80,
             (bool)in_stack_ffffffffffffed7f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  local_ee9[1] = (allocator<char>)0x0;
  local_ee9[2] = (allocator<char>)0x0;
  local_ee9[3] = (allocator<char>)0x0;
  local_ee9[4] = (allocator<char>)0x0;
  local_ee9[5] = (allocator<char>)0x0;
  local_ee9[6] = (allocator<char>)0x0;
  local_ee9[7] = (allocator<char>)0x0;
  local_ee9[8] = (allocator<char>)0x0;
  sStack_ee0 = 0;
  local_ed8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar1);
  RPCResult::RPCResult
            (in_stack_ffffffffffffedb0,in_stack_ffffffffffffedac,
             (string *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
             in_stack_ffffffffffffed98,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffed94,in_stack_ffffffffffffed90),
             (bool)in_stack_ffffffffffffed8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  local_f08 = 0;
  aStack_f00._M_allocated_capacity = 0;
  aStack_f00._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar1);
  RPCResult::RPCResult
            (in_stack_ffffffffffffedb0,in_stack_ffffffffffffedac,
             (string *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
             in_stack_ffffffffffffed98,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffed94,in_stack_ffffffffffffed90),
             (bool)in_stack_ffffffffffffed8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  this_00 = (RPCHelpMan *)local_f0a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  local_f29._1_8_ = 0;
  local_f29._9_8_ = 0;
  local_f29._17_8_ = 0;
  name = (string *)(local_f29 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar1);
  RPCResult::RPCResult
            (in_stack_ffffffffffffedb0,in_stack_ffffffffffffedac,
             (string *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
             in_stack_ffffffffffffed98,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffed94,in_stack_ffffffffffffed90),
             (bool)in_stack_ffffffffffffed8f);
  args = local_988;
  description = (string *)local_f29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  results = (RPCResults *)&local_f2a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  local_f48._0_8_ = (pointer)0x0;
  local_f48._8_8_ = 0;
  local_f48._16_8_ = 0;
  examples = (RPCExamples *)local_f48;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar1);
  paVar2 = (allocator<RPCResult> *)((ulong)pvVar1 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
             in_stack_ffffffffffffeda4,in_stack_ffffffffffffed98,
             SUB41(in_stack_ffffffffffffed94 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffed8f,in_stack_ffffffffffffed88),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed80,
             (bool)in_stack_ffffffffffffed7f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  local_f69[1] = (allocator<char>)0x0;
  local_f69[2] = (allocator<char>)0x0;
  local_f69[3] = (allocator<char>)0x0;
  local_f69[4] = (allocator<char>)0x0;
  local_f69[5] = (allocator<char>)0x0;
  local_f69[6] = (allocator<char>)0x0;
  local_f69[7] = (allocator<char>)0x0;
  local_f69[8] = (allocator<char>)0x0;
  local_f69[9] = (allocator<char>)0x0;
  local_f69[10] = (allocator<char>)0x0;
  local_f69[0xb] = (allocator<char>)0x0;
  local_f69[0xc] = (allocator<char>)0x0;
  local_f69[0xd] = (allocator<char>)0x0;
  local_f69[0xe] = (allocator<char>)0x0;
  local_f69[0xf] = (allocator<char>)0x0;
  local_f69[0x10] = (allocator<char>)0x0;
  local_f69[0x11] = (allocator<char>)0x0;
  local_f69[0x12] = (allocator<char>)0x0;
  local_f69[0x13] = (allocator<char>)0x0;
  local_f69[0x14] = (allocator<char>)0x0;
  local_f69[0x15] = (allocator<char>)0x0;
  local_f69[0x16] = (allocator<char>)0x0;
  local_f69[0x17] = (allocator<char>)0x0;
  local_f69[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffedb0,in_stack_ffffffffffffedac,
             (string *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
             in_stack_ffffffffffffed98,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffed94,in_stack_ffffffffffffed90),
             (bool)in_stack_ffffffffffffed8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  local_f88 = (pointer)0x0;
  pRStack_f80 = (pointer)0x0;
  local_f78 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffedb0,in_stack_ffffffffffffedac,
             (string *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
             in_stack_ffffffffffffed98,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffed94,in_stack_ffffffffffffed90),
             (bool)in_stack_ffffffffffffed8f);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffed78;
  __l_00._M_array = (iterator)in_stack_ffffffffffffed70;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffed7f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed68,__l_00,
             (allocator_type *)in_stack_ffffffffffffed60);
  paVar2 = (allocator<RPCResult> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
             in_stack_ffffffffffffeda4,in_stack_ffffffffffffed98,
             SUB41(in_stack_ffffffffffffed94 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffed8f,in_stack_ffffffffffffed88),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed80,
             (bool)in_stack_ffffffffffffed7f);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffed78;
  __l_01._M_array = (iterator)in_stack_ffffffffffffed70;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffed7f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed68,__l_01,
             (allocator_type *)in_stack_ffffffffffffed60);
  RPCResult::RPCResult
            (in_stack_ffffffffffffedb0,in_stack_ffffffffffffedac,
             (string *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
             in_stack_ffffffffffffed98,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffed94,in_stack_ffffffffffffed90),
             (bool)in_stack_ffffffffffffed8f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  HelpExampleCli(in_stack_ffffffffffffed60,in_stack_ffffffffffffed58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffed7f,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  HelpExampleRpc(in_stack_ffffffffffffed60,in_stack_ffffffffffffed58);
  std::operator+(in_stack_ffffffffffffed60,in_stack_ffffffffffffed58);
  RPCExamples::RPCExamples((RPCExamples *)paVar2,(string *)0x13a1890);
  this = (RPCArg *)local_fb0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<decodescript()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffed38,in_stack_ffffffffffffed30);
  RPCHelpMan::RPCHelpMan(this_00,name,description,args,results,examples,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_fb0 + 0x22));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_f8d);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_f8c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_f8b);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed38);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1210 = local_300;
  do {
    local_1210 = local_1210 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1210 != local_630);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed38);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1228 = local_7f0;
  do {
    local_1228 = local_1228 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1228 != local_b20);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed38);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_f6a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_f69);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed38);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_f4a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_f49);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed38);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_f2a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_f29);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed38);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_f0a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_f0a + 1));
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed38);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_eea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_ee9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed38);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_ed8 + 0xe));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_ec9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_eaa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_ea9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed38);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_e8a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_e89);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed38);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_e6a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_e69);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed38);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_e49);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed38);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_e2a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_e29);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffed38);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_e0a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_e09);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_dea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_dea + 1));
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffed38);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_1240 = local_48;
  do {
    local_1240 = local_1240 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_1240 != local_150);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_dc9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_dc1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_da2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_da1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan decodescript()
{
    return RPCHelpMan{
        "decodescript",
        "\nDecode a hex-encoded script.\n",
        {
            {"hexstring", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "the hex-encoded script"},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "asm", "Disassembly of the script"},
                {RPCResult::Type::STR, "desc", "Inferred descriptor for the script"},
                {RPCResult::Type::STR, "type", "The output type (e.g. " + GetAllOutputTypes() + ")"},
                {RPCResult::Type::STR, "address", /*optional=*/true, "The Bitcoin address (only if a well-defined address exists)"},
                {RPCResult::Type::STR, "p2sh", /*optional=*/true,
                 "address of P2SH script wrapping this redeem script (not returned for types that should not be wrapped)"},
                {RPCResult::Type::OBJ, "segwit", /*optional=*/true,
                 "Result of a witness output script wrapping this redeem script (not returned for types that should not be wrapped)",
                 {
                     {RPCResult::Type::STR, "asm", "Disassembly of the output script"},
                     {RPCResult::Type::STR_HEX, "hex", "The raw output script bytes, hex-encoded"},
                     {RPCResult::Type::STR, "type", "The type of the output script (e.g. witness_v0_keyhash or witness_v0_scripthash)"},
                     {RPCResult::Type::STR, "address", /*optional=*/true, "The Bitcoin address (only if a well-defined address exists)"},
                     {RPCResult::Type::STR, "desc", "Inferred descriptor for the script"},
                     {RPCResult::Type::STR, "p2sh-segwit", "address of the P2SH script wrapping this witness redeem script"},
                 }},
            },
        },
        RPCExamples{
            HelpExampleCli("decodescript", "\"hexstring\"")
          + HelpExampleRpc("decodescript", "\"hexstring\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    UniValue r(UniValue::VOBJ);
    CScript script;
    if (request.params[0].get_str().size() > 0){
        std::vector<unsigned char> scriptData(ParseHexV(request.params[0], "argument"));
        script = CScript(scriptData.begin(), scriptData.end());
    } else {
        // Empty scripts are valid
    }
    ScriptToUniv(script, /*out=*/r, /*include_hex=*/false, /*include_address=*/true);

    std::vector<std::vector<unsigned char>> solutions_data;
    const TxoutType which_type{Solver(script, solutions_data)};

    const bool can_wrap{[&] {
        switch (which_type) {
        case TxoutType::MULTISIG:
        case TxoutType::NONSTANDARD:
        case TxoutType::PUBKEY:
        case TxoutType::PUBKEYHASH:
        case TxoutType::WITNESS_V0_KEYHASH:
        case TxoutType::WITNESS_V0_SCRIPTHASH:
            // Can be wrapped if the checks below pass
            break;
        case TxoutType::NULL_DATA:
        case TxoutType::SCRIPTHASH:
        case TxoutType::WITNESS_UNKNOWN:
        case TxoutType::WITNESS_V1_TAPROOT:
        case TxoutType::ANCHOR:
            // Should not be wrapped
            return false;
        } // no default case, so the compiler can warn about missing cases
        if (!script.HasValidOps() || script.IsUnspendable()) {
            return false;
        }
        for (CScript::const_iterator it{script.begin()}; it != script.end();) {
            opcodetype op;
            CHECK_NONFATAL(script.GetOp(it, op));
            if (op == OP_CHECKSIGADD || IsOpSuccess(op)) {
                return false;
            }
        }
        return true;
    }()};

    if (can_wrap) {
        r.pushKV("p2sh", EncodeDestination(ScriptHash(script)));
        // P2SH and witness programs cannot be wrapped in P2WSH, if this script
        // is a witness program, don't return addresses for a segwit programs.
        const bool can_wrap_P2WSH{[&] {
            switch (which_type) {
            case TxoutType::MULTISIG:
            case TxoutType::PUBKEY:
            // Uncompressed pubkeys cannot be used with segwit checksigs.
            // If the script contains an uncompressed pubkey, skip encoding of a segwit program.
                for (const auto& solution : solutions_data) {
                    if ((solution.size() != 1) && !CPubKey(solution).IsCompressed()) {
                        return false;
                    }
                }
                return true;
            case TxoutType::NONSTANDARD:
            case TxoutType::PUBKEYHASH:
                // Can be P2WSH wrapped
                return true;
            case TxoutType::NULL_DATA:
            case TxoutType::SCRIPTHASH:
            case TxoutType::WITNESS_UNKNOWN:
            case TxoutType::WITNESS_V0_KEYHASH:
            case TxoutType::WITNESS_V0_SCRIPTHASH:
            case TxoutType::WITNESS_V1_TAPROOT:
            case TxoutType::ANCHOR:
                // Should not be wrapped
                return false;
            } // no default case, so the compiler can warn about missing cases
            NONFATAL_UNREACHABLE();
        }()};
        if (can_wrap_P2WSH) {
            UniValue sr(UniValue::VOBJ);
            CScript segwitScr;
            FlatSigningProvider provider;
            if (which_type == TxoutType::PUBKEY) {
                segwitScr = GetScriptForDestination(WitnessV0KeyHash(Hash160(solutions_data[0])));
            } else if (which_type == TxoutType::PUBKEYHASH) {
                segwitScr = GetScriptForDestination(WitnessV0KeyHash(uint160{solutions_data[0]}));
            } else {
                // Scripts that are not fit for P2WPKH are encoded as P2WSH.
                provider.scripts[CScriptID(script)] = script;
                segwitScr = GetScriptForDestination(WitnessV0ScriptHash(script));
            }
            ScriptToUniv(segwitScr, /*out=*/sr, /*include_hex=*/true, /*include_address=*/true, /*provider=*/&provider);
            sr.pushKV("p2sh-segwit", EncodeDestination(ScriptHash(segwitScr)));
            r.pushKV("segwit", std::move(sr));
        }
    }

    return r;
},
    };
}